

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O1

void __thiscall
adios2::helper::NetworkSocket::Connect
          (NetworkSocket *this,string *hostname,uint16_t port,string *protocol)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  in_addr_t iVar3;
  int iVar4;
  protoent *ppVar5;
  long *plVar6;
  hostent *phVar7;
  char *__cp;
  undefined8 *puVar8;
  ulong *puVar9;
  uint __val;
  size_type *psVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint __len;
  size_type __dnew;
  string __str;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val = (uint)port;
  ppVar5 = getprotobyname((protocol->_M_dataplus)._M_p);
  if (ppVar5 == (protoent *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Helper","");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"helper:adiosNetwork","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ConnectToServer","");
    std::operator+(&local_b8,"error: Cannot make getprotobyname \"",protocol);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = plVar6[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d8,&local_138,&local_f8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (hostname->_M_dataplus)._M_p;
  local_78 = hostname;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + hostname->_M_string_length);
  phVar7 = gethostbyname(local_70._M_dataplus._M_p);
  if (phVar7 == (hostent *)0x0) {
    local_d8.field_2._M_allocated_capacity._0_4_ = 0x706c6548;
    local_d8.field_2._M_allocated_capacity._4_2_ = 0x7265;
    local_d8._M_string_length = 6;
    local_d8.field_2._M_local_buf[6] = '\0';
    local_f8._M_dataplus._M_p = (pointer)0x13;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_138._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
    local_138.field_2._M_allocated_capacity = (size_type)local_f8._M_dataplus._M_p;
    *(undefined8 *)local_138._M_dataplus._M_p = 0x613a7265706c6568;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 8) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xb) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xc) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xd) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xe) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x11) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x12) = 'k';
    local_138._M_string_length = (size_type)local_f8._M_dataplus._M_p;
    local_138._M_dataplus._M_p[(long)local_f8._M_dataplus._M_p] = '\0';
    local_f8.field_2._M_allocated_capacity._0_7_ = 0x65766c6f736552;
    local_f8.field_2._M_local_buf[7] = 'H';
    local_f8.field_2._8_7_ = 0x656d614e74736f;
    local_f8._M_string_length = 0xf;
    local_f8.field_2._M_local_buf[0xf] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::operator+(&local_118,"error: gethostbyname ",&local_70);
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d8,&local_138,&local_f8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  __cp = inet_ntoa((in_addr)*(in_addr_t *)*phVar7->h_addr_list);
  iVar3 = inet_addr(__cp);
  if (iVar3 == 0xffffffff) {
    local_d8.field_2._M_allocated_capacity._0_4_ = 0x706c6548;
    local_d8.field_2._M_allocated_capacity._4_2_ = 0x7265;
    local_d8._M_string_length = 6;
    local_d8.field_2._M_local_buf[6] = '\0';
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_f8._M_dataplus._M_p = (pointer)0x13;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_138._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_138,(ulong)&local_f8);
    local_138.field_2._M_allocated_capacity = (size_type)local_f8._M_dataplus._M_p;
    *(undefined8 *)local_138._M_dataplus._M_p = 0x613a7265706c6568;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 8) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xb) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xc) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xd) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xe) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0xf) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x11) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p + 0x12) = 'k';
    local_138._M_string_length = (size_type)local_f8._M_dataplus._M_p;
    local_138._M_dataplus._M_p[(long)local_f8._M_dataplus._M_p] = '\0';
    local_f8.field_2._M_allocated_capacity._0_7_ = 0x65766c6f736552;
    local_f8.field_2._M_local_buf[7] = 'H';
    local_f8.field_2._8_7_ = 0x656d614e74736f;
    local_f8._M_string_length = 0xf;
    local_f8.field_2._M_local_buf[0xf] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::string((string *)&local_b8,*phVar7->h_addr_list,(allocator *)&local_50);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x750879);
    psVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = puVar8[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = psVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d8,&local_138,&local_f8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  *(ulong *)&this->m_Data->m_Sockaddr = (ulong)CONCAT42(iVar3,port << 8 | port >> 8) * 0x10000 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar4 = socket(2,1,ppVar5->p_proto);
  this->m_Data->m_Socket = iVar4;
  if (iVar4 == -1) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Helper","");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"helper:adiosNetwork","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ConnectToServer","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"error: Cannot create socket","");
    Throw<std::ios_base::failure[abi:cxx11]>(&local_d8,&local_138,&local_f8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  iVar4 = connect(this->m_Data->m_Socket,(sockaddr *)this->m_Data,0x10);
  if (iVar4 != -1) {
    return;
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Helper","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"helper:adiosNetwork","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ConnectToServer","");
  std::operator+(&local_50,"error: Cannot connect to server at ",local_78);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  paVar1 = &local_b8.field_2;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_b8.field_2._M_allocated_capacity = *puVar9;
    local_b8.field_2._8_8_ = plVar6[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar9;
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __len = 1;
  if (((9 < port) && (__len = 2, 99 < port)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,__len,__val);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    uVar11 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_90 + local_b8._M_string_length) {
    uVar12 = 0xf;
    if (local_98 != local_88) {
      uVar12 = local_88[0];
    }
    if (local_90 + local_b8._M_string_length <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_00400b78;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
LAB_00400b78:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118.field_2._8_8_ = puVar8[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_118._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  Throw<std::ios_base::failure[abi:cxx11]>(&local_d8,&local_138,&local_f8,&local_118,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void NetworkSocket::Connect(std::string hostname, uint16_t port, std::string protocol)
{
    struct protoent *protoent = getprotobyname(protocol.c_str());
    if (protoent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot make getprotobyname \"" + protocol +
                                                  "\"");
    }

    m_Data->m_Sockaddr = ResolveHostName(hostname, port);

    m_Data->m_Socket = socket(AF_INET, SOCK_STREAM, protoent->p_proto);
    if (m_Data->m_Socket == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot create socket");
    }

    int result = connect(m_Data->m_Socket, (sockaddr *)&(m_Data->m_Sockaddr), sizeof(sockaddr));

    if (result == -1)
    {
        helper::Throw<std::ios_base::failure>("Helper", "helper:adiosNetwork", "ConnectToServer",
                                              "error: Cannot connect to server at " + hostname +
                                                  ":" + std::to_string(port));
    }
}